

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

int __thiscall deci::ast_arg_list_t::Generate(ast_arg_list_t *this,ostream *output,int pc)

{
  pointer ppaVar1;
  ulong uVar2;
  pointer ppaVar3;
  
  uVar2 = (ulong)(uint)pc;
  ppaVar1 = (this->args).super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppaVar3 = (this->args).
                 super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar3 != ppaVar1; ppaVar3 = ppaVar3 + 1) {
    pc = (*(*ppaVar3)->_vptr_ast_item_t[2])(*ppaVar3,output,uVar2);
    uVar2 = (ulong)(uint)pc;
  }
  return pc;
}

Assistant:

int ast_arg_list_t::Generate(std::ostream& output, int pc) const {
    for (auto item: args) {
      pc = item->Generate(output, pc);
    }
    return pc;
  }